

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

intptr_t fio_tcp_socket(char *address,char *port,uint8_t server)

{
  int iVar1;
  int *piVar2;
  addrinfo *local_90;
  addrinfo *i_1;
  int one;
  int optval_1;
  addrinfo *local_78;
  addrinfo *i;
  undefined4 local_68;
  int bound;
  int optval;
  int fd;
  addrinfo *addrinfo;
  addrinfo hints;
  uint8_t server_local;
  char *port_local;
  char *address_local;
  
  hints.ai_next._7_1_ = server;
  memset(&addrinfo,0,0x30);
  memset(&addrinfo,0,0x30);
  addrinfo._4_4_ = 0;
  hints.ai_flags = 1;
  addrinfo._0_4_ = 1;
  iVar1 = getaddrinfo(address,port,(addrinfo *)&addrinfo,(addrinfo **)&optval);
  if (iVar1 == 0) {
    bound = socket(_optval->ai_family,_optval->ai_socktype,_optval->ai_protocol);
    if (bound < 1) {
      freeaddrinfo(_optval);
      address_local = (char *)0xffffffffffffffff;
    }
    else {
      iVar1 = fio_set_non_block(bound);
      if (iVar1 < 0) {
        freeaddrinfo(_optval);
        close(bound);
        address_local = (char *)0xffffffffffffffff;
      }
      else if (hints.ai_next._7_1_ == '\0') {
        i_1._0_4_ = 1;
        setsockopt(bound,6,1,&i_1,4);
        piVar2 = __errno_location();
        *piVar2 = 0;
        for (local_90 = _optval; local_90 != (addrinfo *)0x0; local_90 = local_90->ai_next) {
          iVar1 = connect(bound,local_90->ai_addr,local_90->ai_addrlen);
          if ((iVar1 == 0) || (piVar2 = __errno_location(), *piVar2 == 0x73)) goto LAB_0013f019;
        }
        freeaddrinfo(_optval);
        close(bound);
        address_local = (char *)0xffffffffffffffff;
      }
      else {
        local_68 = 1;
        setsockopt(bound,1,2,&local_68,4);
        i._4_4_ = 0;
        for (local_78 = _optval; local_78 != (addrinfo *)0x0; local_78 = local_78->ai_next) {
          _one = local_78->ai_addr;
          iVar1 = bind(bound,_one,local_78->ai_addrlen);
          if (iVar1 == 0) {
            i._4_4_ = 1;
          }
        }
        if (i._4_4_ == 0) {
          freeaddrinfo(_optval);
          close(bound);
          address_local = (char *)0xffffffffffffffff;
        }
        else {
          i_1._4_4_ = 0x80;
          setsockopt(bound,_optval->ai_protocol,0x17,(void *)((long)&i_1 + 4),4);
          iVar1 = listen(bound,0x1000);
          if (iVar1 < 0) {
            freeaddrinfo(_optval);
            close(bound);
            address_local = (char *)0xffffffffffffffff;
          }
          else {
LAB_0013f019:
            fio_lock((fio_lock_i *)((long)fio_data + (long)bound * 0xa8 + 0x6c));
            fio_clear_fd((long)bound,'\x01');
            fio_unlock((fio_lock_i *)((long)fio_data + (long)bound * 0xa8 + 0x6c));
            fio_tcp_addr_cpy(bound,_optval->ai_family,(sockaddr *)_optval);
            freeaddrinfo(_optval);
            address_local =
                 (char *)(long)CONCAT41(bound,*(undefined1 *)
                                               ((long)fio_data + (long)bound * 0xa8 + 0x6d));
          }
        }
      }
    }
  }
  else {
    address_local = (char *)0xffffffffffffffff;
  }
  return (intptr_t)address_local;
}

Assistant:

static intptr_t fio_tcp_socket(const char *address, const char *port,
                               uint8_t server) {
  /* TCP/IP socket */
  // setup the address
  struct addrinfo hints = {0};
  struct addrinfo *addrinfo;       // will point to the results
  memset(&hints, 0, sizeof hints); // make sure the struct is empty
  hints.ai_family = AF_UNSPEC;     // don't care IPv4 or IPv6
  hints.ai_socktype = SOCK_STREAM; // TCP stream sockets
  hints.ai_flags = AI_PASSIVE;     // fill in my IP for me
  if (getaddrinfo(address, port, &hints, &addrinfo)) {
    // perror("addr err");
    return -1;
  }
  // get the file descriptor
  int fd =
      socket(addrinfo->ai_family, addrinfo->ai_socktype, addrinfo->ai_protocol);
  if (fd <= 0) {
    freeaddrinfo(addrinfo);
    return -1;
  }
  // make sure the socket is non-blocking
  if (fio_set_non_block(fd) < 0) {
    freeaddrinfo(addrinfo);
    close(fd);
    return -1;
  }
  if (server) {
    {
      // avoid the "address taken"
      int optval = 1;
      setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, &optval, sizeof(optval));
    }
    // bind the address to the socket
    int bound = 0;
    for (struct addrinfo *i = addrinfo; i != NULL; i = i->ai_next) {
      if (!bind(fd, i->ai_addr, i->ai_addrlen))
        bound = 1;
    }
    if (!bound) {
      // perror("bind err");
      freeaddrinfo(addrinfo);
      close(fd);
      return -1;
    }
#ifdef TCP_FASTOPEN
    {
      // support TCP Fast Open when available
      int optval = 128;
      setsockopt(fd, addrinfo->ai_protocol, TCP_FASTOPEN, &optval,
                 sizeof(optval));
    }
#endif
    if (listen(fd, SOMAXCONN) < 0) {
      freeaddrinfo(addrinfo);
      close(fd);
      return -1;
    }
  } else {
    int one = 1;
    setsockopt(fd, IPPROTO_TCP, TCP_NODELAY, &one, sizeof(one));
    errno = 0;
    for (struct addrinfo *i = addrinfo; i; i = i->ai_next) {
      if (connect(fd, i->ai_addr, i->ai_addrlen) == 0 || errno == EINPROGRESS)
        goto socket_okay;
    }
    freeaddrinfo(addrinfo);
    close(fd);
    return -1;
  }
socket_okay:
  fio_lock(&fd_data(fd).protocol_lock);
  fio_clear_fd(fd, 1);
  fio_unlock(&fd_data(fd).protocol_lock);
  fio_tcp_addr_cpy(fd, addrinfo->ai_family, (void *)addrinfo);
  freeaddrinfo(addrinfo);
  return fd2uuid(fd);
}